

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O2

bool __thiscall translate::bounding_box(translate *this,double t0,double t1,aabb *output_box)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  
  iVar11 = (*((this->ptr).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_hittable[1])();
  if (SUB41(iVar11,0) != false) {
    dVar2 = (output_box->_min).e[1];
    dVar3 = (output_box->_min).e[2];
    dVar4 = (output_box->_max).e[0];
    dVar5 = (output_box->_max).e[1];
    dVar6 = (output_box->_max).e[2];
    dVar7 = (this->offset).e[0];
    dVar8 = (this->offset).e[1];
    dVar9 = (this->offset).e[1];
    dVar10 = (this->offset).e[2];
    dVar1 = (this->offset).e[2];
    (output_box->_min).e[0] = (output_box->_min).e[0] + dVar7;
    (output_box->_min).e[1] = dVar2 + dVar8;
    (output_box->_min).e[2] = dVar1 + dVar3;
    (output_box->_max).e[0] = dVar7 + dVar4;
    (output_box->_max).e[1] = dVar9 + dVar5;
    (output_box->_max).e[2] = dVar10 + dVar6;
  }
  return SUB41(iVar11,0);
}

Assistant:

bool translate::bounding_box(double t0, double t1, aabb& output_box) const {
    if (!ptr->bounding_box(t0, t1, output_box))
        return false;

    output_box = aabb(
            output_box.min() + offset,
            output_box.max() + offset);

    return true;
}